

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

_Bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiID IVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiWindow_conflict *pIVar3;
  code *pcVar4;
  ImGuiContext_conflict1 *pIVar5;
  _Bool _Var6;
  undefined1 uVar7;
  ImGuiItemFlags *pIVar8;
  ImDrawList *this;
  ImGuiContext_conflict1 *g;
  
  pIVar5 = GImGui;
  if ((((GImGui->HoveredId == id || GImGui->HoveredId == 0) ||
       (GImGui->HoveredIdAllowOverlap == true)) &&
      (pIVar2 = GImGui->CurrentWindow, GImGui->HoveredWindow == pIVar2)) &&
     ((IVar1 = GImGui->ActiveId, IVar1 == id || IVar1 == 0 || (GImGui->ActiveIdAllowOverlap == true)
      ))) {
    _Var6 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if ((_Var6) && (pIVar5->NavDisableMouseHover == false)) {
      if (((((pIVar5->NavWindow == (ImGuiWindow_conflict *)0x0) ||
            (pIVar3 = pIVar5->NavWindow->RootWindowDockTree, pIVar3 == (ImGuiWindow_conflict *)0x0))
           || (pIVar3->WasActive != true)) ||
          ((pIVar3 == pIVar2->RootWindowDockTree || ((pIVar3->Flags & 0xc000000) == 0)))) &&
         ((pIVar2->Viewport == pIVar5->MouseViewport ||
          ((pIVar5->MovingWindow != (ImGuiWindow_conflict *)0x0 &&
           (pIVar2->RootWindowDockTree == pIVar5->MovingWindow->RootWindowDockTree)))))) {
        if (id != 0) {
          pIVar5->HoveredId = id;
          pIVar5->HoveredIdAllowOverlap = false;
          pIVar5->HoveredIdUsingMouseWheel = false;
          if (pIVar5->HoveredIdPreviousFrame != id) {
            pIVar5->HoveredIdTimer = 0.0;
            pIVar5->HoveredIdNotActiveTimer = 0.0;
          }
        }
        pIVar8 = &pIVar5->CurrentItemFlags;
        if ((pIVar5->LastItemData).ID == id) {
          pIVar8 = &(pIVar5->LastItemData).InFlags;
        }
        if ((*pIVar8 & 4) == 0) {
          if (id == 0) {
            return true;
          }
          if ((pIVar5->DebugItemPickerActive == true) && (pIVar5->HoveredIdPreviousFrame == id)) {
            this = GetViewportDrawList(pIVar2->Viewport,1,"##Foreground");
            ImDrawList::AddRect(this,&bb->Min,&bb->Max,0xff00ffff,0.0,0,1.0);
          }
          if (pIVar5->DebugItemPickerBreakId != id) {
            return true;
          }
          pcVar4 = (code *)swi(3);
          uVar7 = (*pcVar4)();
          return (_Bool)uVar7;
        }
        if (IVar1 == id) {
          ClearActiveID();
        }
      }
      pIVar5->HoveredIdDisabled = true;
    }
  }
  return false;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;
    if (g.NavDisableMouseHover)
        return false;
    if (!IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
        SetHoveredID(id);

    // When disabled we'll return false but still set HoveredId
    ImGuiItemFlags item_flags = (g.LastItemData.ID == id ? g.LastItemData.InFlags : g.CurrentItemFlags);
    if (item_flags & ImGuiItemFlags_Disabled)
    {
        // Release active id if turning disabled
        if (g.ActiveId == id)
            ClearActiveID();
        g.HoveredIdDisabled = true;
        return false;
    }

    if (id != 0)
    {
        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we perform the test in ItemAdd(), but that would incur a small runtime cost.
        // #define IMGUI_DEBUG_TOOL_ITEM_PICKER_EX in imconfig.h if you want this check to also be performed in ItemAdd().
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        if (g.DebugItemPickerBreakId == id)
            IM_DEBUG_BREAK();
    }

    return true;
}